

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

void __thiscall ON_V5ExtrusionDisplayMeshCache::DestroyHelper(ON_V5ExtrusionDisplayMeshCache *this)

{
  ON_V5ExtrusionDisplayMeshCache *this_local;
  
  std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void ON_V5ExtrusionDisplayMeshCache::DestroyHelper()
{
  m_render_mesh.reset();
  m_analysis_mesh.reset();
}